

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O3

size_t cali_variant_pack(cali_variant_t v,uchar *buf)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uchar *puVar5;
  anon_union_8_7_33918203_for_value aVar6;
  anon_union_8_7_33918203_for_value aVar7;
  ulong uVar8;
  ulong uVar9;
  
  aVar7 = v.value;
  uVar9 = v.type_and_size;
  lVar2 = 1;
  if (uVar9 < 0x80) {
    lVar4 = 1;
    puVar5 = buf;
  }
  else {
    lVar4 = 0;
    uVar8 = uVar9;
    do {
      lVar3 = lVar4;
      buf[lVar3] = (byte)uVar8 | 0x80;
      uVar9 = uVar8 >> 7;
      bVar1 = 0x3fff < uVar8;
      lVar4 = lVar3 + 1;
      uVar8 = uVar9;
    } while (bVar1);
    lVar4 = lVar3 + 2;
    puVar5 = buf + lVar3 + 1;
  }
  *puVar5 = (uchar)uVar9;
  puVar5 = buf + lVar4;
  if (0x7f < aVar7.v_uint) {
    lVar3 = 0;
    aVar6.v_uint = aVar7.v_uint;
    do {
      lVar2 = lVar3;
      puVar5[lVar2] = aVar6.v_bool | 0x80;
      aVar7.v_uint = aVar6.v_uint >> 7;
      bVar1 = 0x3fff < aVar6.v_uint;
      lVar3 = lVar2 + 1;
      aVar6.v_uint = aVar7.v_uint;
    } while (bVar1);
    puVar5 = puVar5 + lVar2 + 1;
    lVar2 = lVar2 + 2;
  }
  *puVar5 = aVar7.v_bool;
  return lVar2 + lVar4;
}

Assistant:

size_t cali_variant_pack(cali_variant_t v, unsigned char* buf)
{
    size_t pos = 0;

    pos += vlenc_u64(v.type_and_size, buf);
    pos += vlenc_u64(v.value.v_uint, buf + pos);

    return pos;
}